

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O0

int fio_str_iseq(fio_str_s_conflict *str1,fio_str_s_conflict *str2)

{
  int iVar1;
  byte local_51;
  undefined1 local_50 [8];
  fio_str_info_s s2;
  fio_str_info_s s1;
  fio_str_s_conflict *str2_local;
  fio_str_s_conflict *str1_local;
  
  if (str1 == str2) {
    str1_local._4_4_ = 1;
  }
  else if ((str1 == (fio_str_s_conflict *)0x0) || (str2 == (fio_str_s_conflict *)0x0)) {
    str1_local._4_4_ = 0;
  }
  else {
    fio_str_info((fio_str_info_s *)&s2.data,str1);
    fio_str_info((fio_str_info_s *)local_50,str2);
    local_51 = 0;
    if (s1.capa == s2.capa) {
      iVar1 = memcmp((void *)s1.len,(void *)s2.len,s1.capa);
      local_51 = iVar1 != 0 ^ 0xff;
    }
    str1_local._4_4_ = (uint)(local_51 & 1);
  }
  return str1_local._4_4_;
}

Assistant:

inline FIO_FUNC int fio_str_iseq(const fio_str_s *str1, const fio_str_s *str2) {
  if (str1 == str2)
    return 1;
  if (!str1 || !str2)
    return 0;
  fio_str_info_s s1 = fio_str_info(str1);
  fio_str_info_s s2 = fio_str_info(str2);
  return (s1.len == s2.len && !memcmp(s1.data, s2.data, s1.len));
}